

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O1

void utilOnExitRun(void)

{
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = blobSize(_fns);
  if (7 < sVar1) {
    uVar2 = sVar1 >> 3;
    do {
      (*_fns[uVar2 - 1])();
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  blobClose(_fns);
  _fns = (util_onexit_t *)0x0;
  mtMtxClose(_mtx);
  return;
}

Assistant:

static void utilOnExitRun(void)
{
	size_t pos;
	// pre
	ASSERT(blobIsValid(_fns));
	ASSERT(blobSize(_fns) % sizeof(util_onexit_t) == 0);
	// вызвать зарегистрированные функции
	for (pos = blobSize(_fns) / sizeof(util_onexit_t); pos--;)
		_fns[pos]();
	// закрыть список функций
	blobClose(_fns), _fns = 0;
	// закрыть мьютекс
	mtMtxClose(_mtx);
}